

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eh_frame.cc
# Opt level: O0

void bloaty::ReadEhFrame(string_view data,RangeSink *sink)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  size_type sVar5;
  const_reference pvVar7;
  size_t in_RDX;
  RangeSink *sink_00;
  RangeSink *in_RSI;
  char *in_RDI;
  string_view sVar8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  uint64_t address;
  CIEInfo *cie_info_1;
  iterator iter;
  uint8_t encoding;
  string_view aug_string;
  CIEInfo *cie_info;
  uint32_t id;
  string_view entry;
  string_view full_entry;
  CompilationUnitSizes sizes;
  unordered_map<const_void_*,_CIEInfo,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_CIEInfo>_>_>
  cie_map;
  string_view remaining;
  unordered_map<const_void_*,_CIEInfo,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_CIEInfo>_>_>
  *in_stack_fffffffffffffe38;
  string_view *in_stack_fffffffffffffe40;
  _Node_iterator_base<std::pair<const_void_*const,_CIEInfo>,_false> in_stack_fffffffffffffe48;
  string_view *in_stack_fffffffffffffe50;
  undefined5 in_stack_fffffffffffffe58;
  uchar in_stack_fffffffffffffe5d;
  uchar in_stack_fffffffffffffe5e;
  uchar in_stack_fffffffffffffe5f;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe60;
  _Node_iterator_base<std::pair<const_void_*const,_CIEInfo>,_false> local_f0;
  const_pointer local_e8;
  _Node_iterator_base<std::pair<const_void_*const,_CIEInfo>,_false> local_e0;
  uchar local_d1;
  string_view local_d0;
  const_pointer local_c0;
  mapped_type *local_b8;
  uint local_ac;
  char *local_a8;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  string_view *in_stack_ffffffffffffff70;
  undefined2 uVar10;
  basic_string_view<char,_std::char_traits<char>_> local_78 [4];
  uint64_t in_stack_ffffffffffffffd0;
  char *pcVar11;
  size_t sVar6;
  
  pcVar11 = in_RDI;
  std::
  unordered_map<const_void_*,_CIEInfo,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_CIEInfo>_>_>
  ::unordered_map((unordered_map<const_void_*,_CIEInfo,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_CIEInfo>_>_>
                   *)0x20f75c);
  while( true ) {
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd8)
    ;
    if (sVar5 == 0) break;
    local_78[0]._M_len = (size_t)in_RDI;
    local_78[0]._M_str = (char *)in_RSI;
    sVar8 = dwarf::CompilationUnitSizes::ReadInitialLength
                      ((CompilationUnitSizes *)
                       CONCAT17(in_stack_fffffffffffffe5f,
                                CONCAT16(in_stack_fffffffffffffe5e,
                                         CONCAT15(in_stack_fffffffffffffe5d,
                                                  in_stack_fffffffffffffe58))),
                       in_stack_fffffffffffffe50);
    sVar6 = sVar8._M_len;
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff78)
    ;
    if (sVar5 == 0) {
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xffffffffffffffd8);
      if (sVar5 == 0) break;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::size
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff78);
    std::basic_string_view<char,_std::char_traits<char>_>::data
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff78);
    std::basic_string_view<char,_std::char_traits<char>_>::data(local_78);
    bVar9 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (in_stack_fffffffffffffe60,
                       CONCAT17(in_stack_fffffffffffffe5f,
                                CONCAT16(in_stack_fffffffffffffe5e,
                                         CONCAT15(in_stack_fffffffffffffe5d,
                                                  in_stack_fffffffffffffe58))),
                       (size_type)in_stack_fffffffffffffe50);
    sink_00 = (RangeSink *)bVar9._M_str;
    local_a8 = (char *)bVar9._M_len;
    local_78[0]._M_len = (size_t)local_a8;
    local_78[0]._M_str = (char *)sink_00;
    local_ac = ReadFixed<unsigned_int,4ul>(in_stack_fffffffffffffe40);
    uVar10 = (undefined2)(sVar6 >> 0x30);
    if (local_ac == 0) {
      local_c0 = std::basic_string_view<char,_std::char_traits<char>_>::data(local_78);
      local_b8 = std::
                 unordered_map<const_void_*,_CIEInfo,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_CIEInfo>_>_>
                 ::operator[]((unordered_map<const_void_*,_CIEInfo,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_CIEInfo>_>_>
                               *)in_stack_fffffffffffffe40,(key_type *)in_stack_fffffffffffffe38);
      bVar1 = ReadFixed<unsigned_char,1ul>(in_stack_fffffffffffffe40);
      local_b8->version = (uint)bVar1;
      sVar8 = ReadNullTerminated((string_view *)0x20f968);
      local_d0 = sVar8;
      uVar3 = dwarf::ReadLEB128<unsigned_int>(in_stack_fffffffffffffe50);
      local_b8->code_align = uVar3;
      iVar4 = dwarf::ReadLEB128<int>(in_stack_fffffffffffffe50);
      local_b8->data_align = iVar4;
      if (local_b8->version == 1) {
        bVar1 = ReadFixed<unsigned_char,1ul>(in_stack_fffffffffffffe40);
        local_b8->return_address_reg = (uint)bVar1;
      }
      else {
        if (local_b8->version != 3) {
          Throw((char *)in_stack_fffffffffffffe50,
                (int)((ulong)in_stack_fffffffffffffe48._M_cur >> 0x20));
        }
        uVar3 = dwarf::ReadLEB128<unsigned_int>(in_stack_fffffffffffffe50);
        local_b8->return_address_reg = uVar3;
      }
      while( true ) {
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_d0);
        if (sVar5 == 0) break;
        pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_d0,0);
        in_stack_fffffffffffffe60 =
             (basic_string_view<char,_std::char_traits<char>_> *)(ulong)((int)*pvVar7 - 0x4c);
        switch(in_stack_fffffffffffffe60) {
        case (basic_string_view<char,_std::char_traits<char>_> *)0x0:
          in_stack_fffffffffffffe5f = ReadFixed<unsigned_char,1ul>(in_stack_fffffffffffffe40);
          local_b8->lsda_encoding = in_stack_fffffffffffffe5f;
          break;
        default:
          Throw((char *)in_stack_fffffffffffffe50,
                (int)((ulong)in_stack_fffffffffffffe48._M_cur >> 0x20));
        case (basic_string_view<char,_std::char_traits<char>_> *)0x4:
          in_stack_fffffffffffffe5d = ReadFixed<unsigned_char,1ul>(in_stack_fffffffffffffe40);
          local_d1 = in_stack_fffffffffffffe5d;
          in_stack_fffffffffffffe50 =
               (string_view *)
               ReadEncodedPointer((uint8_t)(sVar6 >> 0x38),SUB81(sVar6 >> 0x30,0),
                                  in_stack_ffffffffffffff70,
                                  (char *)CONCAT44(in_stack_ffffffffffffff6c,
                                                   in_stack_ffffffffffffff68),sink_00);
          local_b8->personality_function = (uint64_t)in_stack_fffffffffffffe50;
          break;
        case (basic_string_view<char,_std::char_traits<char>_> *)0x6:
          in_stack_fffffffffffffe5e = ReadFixed<unsigned_char,1ul>(in_stack_fffffffffffffe40);
          local_b8->fde_encoding = in_stack_fffffffffffffe5e;
          break;
        case (basic_string_view<char,_std::char_traits<char>_> *)0x7:
          local_b8->is_signal_handler = true;
          break;
        case (basic_string_view<char,_std::char_traits<char>_> *)0x2e:
          local_b8->has_augmentation_length = true;
          dwarf::ReadLEB128<unsigned_int>(in_stack_fffffffffffffe50);
        }
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(&local_d0,1);
      }
    }
    else {
      local_e8 = std::basic_string_view<char,_std::char_traits<char>_>::data
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            &stack0xffffffffffffff78);
      local_e8 = local_e8 + (-4 - (ulong)local_ac);
      in_stack_fffffffffffffe48._M_cur =
           (__node_type *)
           std::
           unordered_map<const_void_*,_CIEInfo,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_CIEInfo>_>_>
           ::find(in_stack_fffffffffffffe38,(key_type *)0x20fbe3);
      local_e0._M_cur = in_stack_fffffffffffffe48._M_cur;
      local_f0._M_cur =
           (__node_type *)
           std::
           unordered_map<const_void_*,_CIEInfo,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_CIEInfo>_>_>
           ::end(in_stack_fffffffffffffe38);
      bVar2 = std::__detail::operator==(&local_e0,&local_f0);
      if (bVar2) {
        Throw((char *)in_stack_fffffffffffffe50,
              (int)((ulong)in_stack_fffffffffffffe48._M_cur >> 0x20));
      }
      std::__detail::_Node_iterator<std::pair<const_void_*const,_CIEInfo>,_false,_false>::operator->
                ((_Node_iterator<std::pair<const_void_*const,_CIEInfo>,_false,_false> *)0x20fc47);
      in_stack_fffffffffffffe40 =
           (string_view *)
           ReadEncodedPointer((uint8_t)((ushort)uVar10 >> 8),SUB21(uVar10,0),
                              in_stack_ffffffffffffff70,
                              (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                              sink_00);
      sVar8._M_str = pcVar11;
      sVar8._M_len = in_RDX;
      RangeSink::AddFileRangeForVMAddr(in_RSI,in_RDI,in_stack_ffffffffffffffd0,sVar8);
    }
  }
  std::
  unordered_map<const_void_*,_CIEInfo,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_CIEInfo>_>_>
  ::~unordered_map((unordered_map<const_void_*,_CIEInfo,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_CIEInfo>_>_>
                    *)0x20fcee);
  return;
}

Assistant:

void ReadEhFrame(string_view data, RangeSink* sink) {
  string_view remaining = data;

  struct CIEInfo {
    int version = 0;
    uint32_t code_align = 0;
    int32_t data_align = 0;
    uint8_t fde_encoding = 0;
    uint8_t lsda_encoding = 0;
    bool is_signal_handler = false;
    bool has_augmentation_length = false;
    uint64_t personality_function = 0;
    uint32_t return_address_reg = 0;
  };

  std::unordered_map<const void*, CIEInfo> cie_map;

  while (remaining.size() > 0) {
    dwarf::CompilationUnitSizes sizes;
    string_view full_entry = remaining;
    string_view entry = sizes.ReadInitialLength(&remaining);
    if (entry.size() == 0 && remaining.size() == 0) {
      return;
    }
    full_entry =
        full_entry.substr(0, entry.size() + (entry.data() - full_entry.data()));
    uint32_t id = ReadFixed<uint32_t>(&entry);
    if (id == 0) {
      // CIE, we don't attribute this yet.
      CIEInfo& cie_info = cie_map[full_entry.data()];
      cie_info.version = ReadFixed<uint8_t>(&entry);
      string_view aug_string = ReadNullTerminated(&entry);
      cie_info.code_align = dwarf::ReadLEB128<uint32_t>(&entry);
      cie_info.data_align = dwarf::ReadLEB128<int32_t>(&entry);
      switch (cie_info.version) {
        case 1:
          cie_info.return_address_reg = ReadFixed<uint8_t>(&entry);
          break;
        case 3:
          cie_info.return_address_reg = dwarf::ReadLEB128<uint32_t>(&entry);
          break;
        default:
          THROW("Unexpected eh_frame CIE version");
      }
      while (aug_string.size() > 0) {
        switch (aug_string[0]) {
          case 'z':
            // Length until the end of augmentation data.
            cie_info.has_augmentation_length = true;
            dwarf::ReadLEB128<uint32_t>(&entry);
            break;
          case 'L':
            cie_info.lsda_encoding = ReadFixed<uint8_t>(&entry);
            break;
          case 'R':
            cie_info.fde_encoding = ReadFixed<uint8_t>(&entry);
            break;
          case 'S':
            cie_info.is_signal_handler = true;
            break;
          case 'P': {
            uint8_t encoding = ReadFixed<uint8_t>(&entry);
            cie_info.personality_function =
                ReadEncodedPointer(encoding, true, &entry, nullptr, sink);
            break;
          }
          default:
            THROW("Unexepcted augmentation character");
        }
        aug_string.remove_prefix(1);
      }
    } else {
      auto iter = cie_map.find(entry.data() - id - 4);
      if (iter == cie_map.end()) {
        THROW("Couldn't find CIE for FDE");
      }
      const CIEInfo& cie_info = iter->second;
      // TODO(haberman): don't hard-code 64-bit.
      uint64_t address = ReadEncodedPointer(cie_info.fde_encoding, true, &entry,
                                            nullptr, sink);
      // TODO(haberman); Technically the FDE addresses could span a
      // function/compilation unit?  They can certainly span inlines.
      /*
      uint64_t length =
        ReadEncodedPointer(cie_info.fde_encoding & 0xf, true, &entry, sink);
      (void)length;

      if (cie_info.has_augmentation_length) {
        uint32_t augmentation_length = dwarf::ReadLEB128<uint32_t>(&entry);
        (void)augmentation_length;
      }

      uint64_t lsda =
          ReadEncodedPointer(cie_info.lsda_encoding, true, &entry, sink);
      if (lsda) {
      }
      */

      sink->AddFileRangeForVMAddr("dwarf_fde", address, full_entry);
    }
  }
}